

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O1

string * __thiscall
cmFindPathCommand::FindHeaderInFramework
          (string *__return_storage_ptr__,cmFindPathCommand *this,string *file,string *dir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GlobInternals *pGVar2;
  GlobInternals *pGVar3;
  char cVar4;
  pointer pcVar5;
  undefined1 *puVar6;
  bool bVar7;
  long lVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  GlobInternals *pGVar9;
  string glob;
  string frameWorkName;
  string fileName;
  Glob globIt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  undefined1 local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  char *local_100;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  long local_d8 [2];
  cmFindPathCommand *local_c8;
  undefined1 local_c0 [24];
  size_type sStack_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_e8._M_allocated_capacity = (size_type)local_d8;
  pcVar5 = (file->_M_dataplus)._M_p;
  local_c8 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_f8 + 0x10),pcVar5,pcVar5 + file->_M_string_length);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
  local_100 = (char *)0x0;
  local_f8[0] = 0;
  lVar8 = std::__cxx11::string::find((char *)(local_f8 + 0x10),0x5def02,0);
  if (lVar8 != -1) {
    std::__cxx11::string::substr((ulong)local_c0,(ulong)(local_f8 + 0x10));
    std::__cxx11::string::operator=((string *)(local_f8 + 0x10),(string *)local_c0);
    pGVar2 = (GlobInternals *)(local_c0 + 0x10);
    if ((GlobInternals *)local_c0._0_8_ != pGVar2) {
      operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
    }
    std::__cxx11::string::_M_assign((string *)&local_108);
    std::__cxx11::string::substr((ulong)local_c0,(ulong)&local_108);
    std::__cxx11::string::operator=((string *)&local_108,(string *)local_c0);
    if ((GlobInternals *)local_c0._0_8_ != pGVar2) {
      operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
    }
    lVar8 = std::__cxx11::string::find((char *)&local_108,0x5def02,0);
    if (lVar8 != -1) {
      std::__cxx11::string::_M_assign((string *)(local_f8 + 0x10));
      std::__cxx11::string::_M_replace((ulong)&local_108,0,local_100,0x5e5069);
    }
    if (local_100 != (char *)0x0) {
      pcVar5 = (dir->_M_dataplus)._M_p;
      local_c0._0_8_ = pGVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c0,pcVar5,pcVar5 + dir->_M_string_length);
      std::__cxx11::string::_M_append(local_c0,(ulong)local_108);
      std::__cxx11::string::append(local_c0);
      pGVar3 = (GlobInternals *)(local_128 + 0x10);
      local_128._0_8_ = pGVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_128,local_c0._0_8_,
                 (pointer)((long)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_c0._0_8_)->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + local_c0._8_8_));
      std::__cxx11::string::append(local_128);
      std::__cxx11::string::_M_append(local_128,local_e8._M_allocated_capacity);
      bVar7 = cmsys::SystemTools::FileExists((char *)local_128._0_8_);
      if (bVar7) {
        cVar4 = (local_c8->super_cmFindBase).field_0x242;
        paVar1 = &__return_storage_ptr__->field_2;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
        if (cVar4 == '\x01') {
          if ((GlobInternals *)local_128._0_8_ == pGVar3) {
            paVar1->_M_allocated_capacity = local_128._16_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_128._24_8_;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_128._0_8_;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = local_128._16_8_;
          }
          puVar6 = local_128;
          __return_storage_ptr__->_M_string_length = local_128._8_8_;
          pGVar9 = pGVar3;
          local_128._0_8_ = pGVar3;
        }
        else {
          if ((GlobInternals *)local_c0._0_8_ == pGVar2) {
            paVar1->_M_allocated_capacity = local_c0._16_8_;
            *(size_type *)((long)&__return_storage_ptr__->field_2 + 8) = sStack_a8;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_c0._0_8_;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = local_c0._16_8_;
          }
          puVar6 = local_c0;
          __return_storage_ptr__->_M_string_length = local_c0._8_8_;
          pGVar9 = pGVar2;
          local_c0._0_8_ = pGVar2;
        }
        *(undefined8 *)(puVar6 + 8) = 0;
        *(char *)&(pGVar9->Files).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = '\0';
        if ((GlobInternals *)local_128._0_8_ != pGVar3) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        if ((GlobInternals *)local_c0._0_8_ != pGVar2) {
          operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
        }
        if (bVar7) goto LAB_003cfe41;
      }
      else {
        if ((GlobInternals *)local_128._0_8_ != pGVar3) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        if ((GlobInternals *)local_c0._0_8_ != pGVar2) {
          operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
        }
      }
    }
  }
  pcVar5 = (dir->_M_dataplus)._M_p;
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_128,pcVar5,pcVar5 + dir->_M_string_length);
  std::__cxx11::string::append(local_128);
  std::__cxx11::string::_M_append(local_128,(ulong)(file->_M_dataplus)._M_p);
  cmsys::Glob::Glob((Glob *)local_c0);
  cmsys::Glob::FindFiles((Glob *)local_c0,(string *)local_128,(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,__x);
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    cmsys::SystemTools::CollapseFullPath
              (__return_storage_ptr__,
               local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    if ((local_c8->super_cmFindBase).field_0x242 == '\0') {
      cmsys::SystemTools::GetFilenamePath(&local_50,__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  cmsys::Glob::~Glob((Glob *)local_c0);
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
LAB_003cfe41:
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8) {
    operator_delete(local_108,CONCAT71(local_f8._1_7_,local_f8[0]) + 1);
  }
  if ((long *)local_e8._M_allocated_capacity != local_d8) {
    operator_delete((void *)local_e8._M_allocated_capacity,local_d8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmFindPathCommand::FindHeaderInFramework(std::string const& file,
                                         std::string const& dir)
{
  std::string fileName = file;
  std::string frameWorkName;
  std::string::size_type pos = fileName.find("/");
  // if there is a / in the name try to find the header as a framework
  // For example bar/foo.h would look for:
  // bar.framework/Headers/foo.h
  if(pos != fileName.npos)
    {
    // remove the name from the slash;
    fileName = fileName.substr(pos+1);
    frameWorkName = file;
    frameWorkName =
      frameWorkName.substr(0, frameWorkName.size()-fileName.size()-1);
    // if the framework has a path in it then just use the filename
    if(frameWorkName.find("/") != frameWorkName.npos)
      {
      fileName = file;
      frameWorkName = "";
      }
    if(!frameWorkName.empty())
      {
      std::string fpath = dir;
      fpath += frameWorkName;
      fpath += ".framework";
      std::string intPath = fpath;
      intPath += "/Headers/";
      intPath += fileName;
      if(cmSystemTools::FileExists(intPath.c_str()))
        {
        if(this->IncludeFileInPath)
          {
          return intPath;
          }
        return fpath;
        }
      }
    }
  // if it is not found yet or not a framework header, then do a glob search
  // for all frameworks in the directory: dir/*.framework/Headers/<file>
  std::string glob = dir;
  glob += "*.framework/Headers/";
  glob += file;
  cmsys::Glob globIt;
  globIt.FindFiles(glob);
  std::vector<std::string> files = globIt.GetFiles();
  if(!files.empty())
    {
    std::string fheader = cmSystemTools::CollapseFullPath(files[0]);
    if(this->IncludeFileInPath)
      {
      return fheader;
      }
    fheader = cmSystemTools::GetFilenamePath(fheader);
    return fheader;
    }
  return "";
}